

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampDepthCompareCase::
TextureBorderClampDepthCompareCase
          (TextureBorderClampDepthCompareCase *this,Context *context,char *name,char *description,
          deUint32 texFormat,SizeType sizeType,deUint32 filter,SamplingFunction samplingFunction)

{
  int texHeight;
  int texWidth;
  SizeType sizeType_local;
  deUint32 texFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureBorderClampDepthCompareCase *this_local;
  
  texWidth = 0xd;
  if (sizeType == SIZE_POT) {
    texWidth = 0x20;
  }
  texHeight = 0x11;
  if (sizeType == SIZE_POT) {
    texHeight = 0x10;
  }
  TextureBorderClampTest::TextureBorderClampTest
            (&this->super_TextureBorderClampTest,context,name,description,texFormat,MODE_DEPTH,
             STATE_TEXTURE_PARAM,texWidth,texHeight,samplingFunction,1);
  (this->super_TextureBorderClampTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampDepthCompareCase_032b69c8;
  this->m_filter = filter;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::vector(&this->m_iterations);
  return;
}

Assistant:

TextureBorderClampDepthCompareCase::TextureBorderClampDepthCompareCase (Context&			context,
																		const char*			name,
																		const char*			description,
																		deUint32			texFormat,
																		SizeType			sizeType,
																		deUint32			filter,
																		SamplingFunction	samplingFunction)
	: TextureBorderClampTest(context,
							 name,
							 description,
							 texFormat,
							 tcu::Sampler::MODE_DEPTH,
							 TextureBorderClampTest::STATE_TEXTURE_PARAM,
							 (sizeType == SIZE_POT) ? (32) : (13),
							 (sizeType == SIZE_POT) ? (16) : (17),
							 samplingFunction,
							 FLAG_USE_SHADOW_SAMPLER)
	, m_filter				(filter)
{
}